

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptFunction.cpp
# Opt level: O2

Var Js::JavascriptFunction::EntryToString(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  undefined4 *puVar5;
  RecyclableObject *aValue;
  JavascriptProxy *this;
  JavascriptFunction *pJVar6;
  undefined4 extraout_var;
  Var pvVar7;
  int in_stack_00000010;
  CallInfo local_38;
  CallInfo callInfo_local;
  ArgumentReader args;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  local_38 = callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (callInfo._0_4_ != in_stack_00000010) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptFunction.cpp"
                                ,0x624,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00a898f5;
    *puVar5 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&callInfo_local,&local_38,(Var *)&stack0x00000018);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)local_38 & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptFunction.cpp"
                                ,0x627,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) goto LAB_00a898f5;
    *puVar5 = 0;
  }
  aValue = (RecyclableObject *)Arguments::operator[]((Arguments *)&callInfo_local,0);
  while( true ) {
    bVar3 = VarIs<Js::JavascriptProxy>(aValue);
    if (!bVar3) break;
    bVar3 = JavascriptConversion::IsCallable(aValue);
    if (!bVar3) break;
    this = VarTo<Js::JavascriptProxy>(aValue);
    aValue = JavascriptProxy::GetTarget(this);
  }
  if ((callInfo_local._0_4_ & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptFunction.cpp"
                                ,0x633,"(args.Info.Count > 0)",
                                "Should always have implicit \'this\'");
    if (!bVar3) {
LAB_00a898f5:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
    if ((callInfo_local._0_4_ & 0xffffff) == 0) goto LAB_00a898f7;
  }
  bVar3 = VarIs<Js::JavascriptFunction>(aValue);
  if (bVar3) {
    pJVar6 = VarTo<Js::JavascriptFunction>(aValue);
    iVar4 = (*(pJVar6->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x6d])(pJVar6);
    pvVar7 = CrossSite::MarshalVar(pSVar1,(Var)CONCAT44(extraout_var,iVar4),false);
    return pvVar7;
  }
LAB_00a898f7:
  JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ec40,L"Function.prototype.toString");
}

Assistant:

Var JavascriptFunction::EntryToString(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        Assert(!(callInfo.Flags & CallFlags_New));

        Var arg0 = args[0];

        // callable proxy is considered as having [[Call]] internal method
        // and should behave here like a function.
        // we will defer to the underlying target.
        while (VarIs<JavascriptProxy>(arg0) && JavascriptConversion::IsCallable(arg0))
        {
            arg0 = VarTo<JavascriptProxy>(arg0)->GetTarget();
        }

        AssertMsg(args.Info.Count > 0, "Should always have implicit 'this'");
        if (args.Info.Count == 0 || !VarIs<JavascriptFunction>(arg0))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedFunction, _u("Function.prototype.toString"));
        }
        JavascriptFunction *pFunc = VarTo<JavascriptFunction>(arg0);

        // pFunc can be from a different script context if Function.prototype.toString is invoked via .call/.apply.
        // Marshal the resulting string to the current script context (that of the toString)
        return CrossSite::MarshalVar(scriptContext, pFunc->EnsureSourceString());
    }